

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execLink<(moira::Instr)68,(moira::Mode)12,(moira::Size)2>(Moira *this,u16 opcode)

{
  uint uVar1;
  u32 *puVar2;
  ushort uVar3;
  uint uVar4;
  u16 uVar5;
  u32 uVar6;
  ulong uVar7;
  AEStackFrame frame;
  
  uVar3 = (this->queue).ird;
  uVar4 = (this->reg).field_3.field_0.a[7];
  uVar1 = uVar4 - 4;
  uVar5 = (this->queue).irc;
  readExt(this);
  uVar7 = (ulong)(opcode & 7);
  if ((uVar4 & 1) == 0) {
    push<(moira::Size)4,0ul>(this,*(u32 *)((long)this->exec + uVar7 * 4 + -0x38));
    *(uint *)((long)this->exec + uVar7 * 4 + -0x38) = uVar1;
    puVar2 = (this->reg).field_3.field_0.a + 7;
    *puVar2 = *puVar2 + (int)(short)uVar5;
    uVar6 = (this->reg).pc;
    (this->reg).pc0 = uVar6;
    (this->queue).ird = (this->queue).irc;
    uVar6 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar6 + 2);
    (this->queue).irc = (u16)uVar6;
    return;
  }
  *(uint *)((long)this->exec + uVar7 * 4 + -0x38) = uVar1;
  uVar6 = (this->reg).pc;
  uVar5 = getSR(this,&(this->reg).sr);
  this->fcl = '\x01';
  frame._0_8_ = ((ulong)uVar1 << 0x20) + (ulong)(uVar3 & 0xffffffe0) + (ulong)(this->reg).sr.s * 4 +
                1;
  frame.pc = uVar6 + 2;
  frame.sr = uVar5;
  frame.ird = uVar3;
  execAddressError(this,frame,0);
  return;
}

Assistant:

void
Moira::execLink(u16 opcode)
{
    u16 ird  = getIRD();
    u32 sp   = getSP() - 4;
    
    int ax   = _____________xxx(opcode);
    i16 disp = (i16)readI<S>();

    // Check for address error
    if (misaligned<Long>(sp)) {
        writeA(ax, sp);
        execAddressError(makeFrame<AE_DATA|AE_WRITE>(sp, getPC() + 2, getSR(), ird));
        return;
    }
    
    // Write to stack
    push <Long> (readA(ax) - ((MIMIC_MUSASHI && ax == 7) ? 4 : 0));

    // Modify address register and stack pointer
    writeA(ax, sp);
    reg.sp += (i32)disp;

    prefetch<POLLIPL>();
}